

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbstrmatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::Clone
          (TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this)

{
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  TPZBandStructMatrix((TPZBandStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                       *)this_00,this);
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZBandStructMatrix(*this);
}